

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

Expression * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::Slot::makeExpr(Slot *this,Module *module)

{
  size_t sVar1;
  Expression *pEVar2;
  Binary *left;
  Const *right;
  undefined1 local_40 [8];
  Builder builder;
  anon_class_16_2_29deed5a makeIndex;
  
  builder.wasm = (Module *)local_40;
  sVar1 = (this->global).super_IString.str._M_len;
  local_40 = (undefined1  [8])module;
  if (sVar1 == 0) {
    left = (Binary *)
           makeExpr::anon_class_16_2_29deed5a::operator()((anon_class_16_2_29deed5a *)&builder);
  }
  else {
    pEVar2 = (Expression *)(this->global).super_IString.str._M_str;
    left = (Binary *)MixedArena::alloc<wasm::GlobalGet>(&module->allocator);
    (((Name *)&left->op)->super_IString).str._M_len = sVar1;
    left->left = pEVar2;
    (((SpecificExpression<(wasm::Expression::Id)10> *)
     &left->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression).type.id = 2;
    if (this->index != 0) {
      right = makeExpr::anon_class_16_2_29deed5a::operator()((anon_class_16_2_29deed5a *)&builder);
      left = Builder::makeBinary((Builder *)local_40,AddInt32,(Expression *)left,(Expression *)right
                                );
    }
  }
  return (Expression *)left;
}

Assistant:

Expression* TableSlotManager::Slot::makeExpr(Module& module) {
  Builder builder(module);
  auto makeIndex = [&]() { return builder.makeConst(int32_t(index)); };
  if (global.size()) {
    Expression* getBase = builder.makeGlobalGet(global, Type::i32);
    return index == 0 ? getBase
                      : builder.makeBinary(AddInt32, getBase, makeIndex());
  } else {
    return makeIndex();
  }
}